

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

void __thiscall
nuraft::asio_rpc_client::execute_resolver
          (asio_rpc_client *this,ptr<asio_rpc_client> *self,ptr<req_msg> *req,string *host,
          string *port,rpc_handler *when_done,uint64_t send_timeout_ms)

{
  _Any_data *this_00;
  pointer pcVar1;
  query q;
  undefined1 local_130 [72];
  _Alloc_hider local_e8;
  char local_d8 [16];
  _Alloc_hider local_c8;
  char local_b8 [16];
  uint64_t local_a8;
  basic_resolver_query<asio::ip::tcp> local_a0;
  
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&local_a0,host,port,all_matching);
  local_130._0_8_ =
       (self->super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_130._8_8_ =
       (self->super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_)->_M_use_count + 1;
    }
  }
  local_130._24_8_ = (req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_130._32_8_ =
       (req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._32_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._32_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._32_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._32_8_)->_M_use_count + 1;
    }
  }
  this_00 = (_Any_data *)(local_130 + 0x28);
  local_130._16_8_ = this;
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            *)this_00,when_done);
  pcVar1 = (host->_M_dataplus)._M_p;
  local_e8._M_p = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + host->_M_string_length);
  pcVar1 = (port->_M_dataplus)._M_p;
  local_c8._M_p = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + port->_M_string_length);
  local_a8 = send_timeout_ms;
  asio::detail::resolver_service<asio::ip::tcp>::
  async_resolve<nuraft::asio_rpc_client::execute_resolver(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long)::_lambda(std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)_1_,asio::any_io_executor>
            ((this->resolver_).impl_.service_,&(this->resolver_).impl_.implementation_,&local_a0,
             (anon_class_144_7_15cfdda5 *)local_130,&(this->resolver_).impl_.executor_);
  if (local_c8._M_p != local_b8) {
    operator_delete(local_c8._M_p);
  }
  if (local_e8._M_p != local_d8) {
    operator_delete(local_e8._M_p);
  }
  if ((_Manager_type)local_130._56_8_ != (_Manager_type)0x0) {
    (*(code *)local_130._56_8_)(this_00,this_00,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._32_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.service_name_._M_dataplus._M_p != &local_a0.service_name_.field_2) {
    operator_delete(local_a0.service_name_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.host_name_._M_dataplus._M_p != &local_a0.host_name_.field_2) {
    operator_delete(local_a0.host_name_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void execute_resolver(ptr<asio_rpc_client> self,
                          ptr<req_msg> req,
                          const std::string& host,
                          const std::string& port,
                          rpc_handler when_done,
                          uint64_t send_timeout_ms) {
        asio::ip::tcp::resolver::query q
            ( host, port, asio::ip::tcp::resolver::query::all_matching );

        resolver_.async_resolve
        ( q,
          [self, this, req, when_done, host, port, send_timeout_ms]
          ( std::error_code err,
            asio::ip::tcp::resolver::iterator itor ) -> void
        {
            if (!err) {
                asio::async_connect
                    ( socket(),
                      itor,
                      std::bind( &asio_rpc_client::connected,
                                 self,
                                 req,
                                 when_done,
                                 send_timeout_ms,
                                 std::placeholders::_1,
                                 std::placeholders::_2 ) );
            } else {
                ptr<resp_msg> rsp;
                ptr<rpc_exception> except
                   ( cs_new<rpc_exception>
                           ( lstrfmt("failed to resolve host %s "
                                     "due to error %d, %s")
                                    .fmt( host.c_str(),
                                          err.value(),
                                          err.message().c_str() ),
                             req ) );
                when_done(rsp, except);
            }
        } );
    }